

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O1

QTextStream * __thiscall QTextStream::operator<<(QTextStream *this,char c)

{
  QTextStreamPrivate *this_00;
  QString *this_01;
  QChar ch;
  long in_FS_OFFSET;
  QChar local_1a;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr)._M_t.
            super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t
            .super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
            super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
  this_01 = this_00->string;
  if ((this_01 == (QString *)0x0) && (this_00->device == (QIODevice *)0x0)) {
    operator<<((QTextStream *)0x0);
  }
  else {
    local_1a.ucs._1_1_ = 0;
    local_1a.ucs._0_1_ = c;
    if ((this_00->params).fieldWidth < 1) {
      if (this_01 == (QString *)0x0) {
        QString::append(&this_00->writeBuffer,local_1a);
        if (0x4000 < (ulong)*(qsizetype *)((long)&(this_00->writeBuffer).d + 0x10)) {
          QTextStreamPrivate::flushWriteBuffer(this_00);
        }
      }
      else {
        ch.ucs._1_1_ = 0;
        ch.ucs._0_1_ = c;
        QString::append(this_01,ch);
      }
    }
    else {
      QTextStreamPrivate::putString(this_00,&local_1a,1,false);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &QTextStream::operator<<(char c)
{
    Q_D(QTextStream);
    CHECK_VALID_STREAM(*this);
    d->putChar(QChar::fromLatin1(c));
    return *this;
}